

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedPointerVector.hpp
# Opt level: O0

optional<unsigned_long> __thiscall
gmlc::containers::MappedPointerVector<helics::FederateState,std::__cxx11::string>::
insert<std::__cxx11::string,helics::CoreFederateInfo_const&>
          (MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchValue,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data,
          CoreFederateInfo *data_1)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  vector<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
  *in_RDI;
  optional<unsigned_long> oVar3;
  size_type index;
  iterator fnd;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff78;
  unsigned_long *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  CoreFederateInfo *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_38 [5];
  _Storage<unsigned_long,_true> local_10;
  undefined1 local_8;
  
  local_38[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x4bbb73);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = std::__detail::operator==(local_38,&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::
    vector<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
    ::size(in_RDI);
    __t = (unsigned_long *)&stack0xffffffffffffffa8;
    std::make_unique<helics::FederateState,std::__cxx11::string,helics::CoreFederateInfo_const&>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::
    vector<std::unique_ptr<helics::FederateState,std::default_delete<helics::FederateState>>,std::allocator<std::unique_ptr<helics::FederateState,std::default_delete<helics::FederateState>>>>
    ::
    emplace_back<std::unique_ptr<helics::FederateState,std::default_delete<helics::FederateState>>>
              ((vector<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
               (unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_> *)
               in_stack_ffffffffffffff88);
    std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>::~unique_ptr
              ((unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_> *)
               CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90));
    std::
    unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
    ::emplace<std::__cxx11::string_const&,unsigned_long&>
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,(unsigned_long *)in_RDI);
    std::optional<unsigned_long>::optional<unsigned_long,_true>
              ((optional<unsigned_long> *)in_RDI,__t);
    uVar2 = extraout_RDX_00;
  }
  else {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_10);
    uVar2 = extraout_RDX;
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_8;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_10._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(const searchType& searchValue, Us&&... data)
    {
        auto fnd = lookup.find(searchValue);
        if (fnd != lookup.end()) {
            return std::nullopt;
        }
        auto index = dataStorage.size();
        dataStorage.emplace_back(
            std::make_unique<VType>(std::forward<Us>(data)...));
        lookup.emplace(searchValue, index);
        return index;
    }